

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

QLayoutItem * __thiscall QMainWindowLayoutState::item(QMainWindowLayoutState *this,QList<int> *path)

{
  int iVar1;
  QToolBarAreaLayoutItem *pQVar2;
  QDockAreaLayoutItem *pQVar3;
  QLayoutItem *pQVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<int> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = *(path->d).ptr;
  if (iVar1 == 1) {
    QList<int>::mid((QList<int> *)&local_30,path,1,-1);
    pQVar3 = QDockAreaLayout::item(&this->dockAreaLayout,(QList<int> *)&local_30);
    pQVar4 = pQVar3->widgetItem;
    QArrayDataPointer<int>::~QArrayDataPointer(&local_30);
  }
  else if (iVar1 == 0) {
    QList<int>::mid((QList<int> *)&local_30,path,1,-1);
    pQVar2 = QToolBarAreaLayout::item(&this->toolBarAreaLayout,(QList<int> *)&local_30);
    QArrayDataPointer<int>::~QArrayDataPointer(&local_30);
    pQVar4 = pQVar2->widgetItem;
  }
  else {
    pQVar4 = (QLayoutItem *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return pQVar4;
  }
  __stack_chk_fail();
}

Assistant:

QLayoutItem *QMainWindowLayoutState::item(const QList<int> &path)
{
    int i = path.first();

#if QT_CONFIG(toolbar)
    if (i == 0) {
        const QToolBarAreaLayoutItem *tbItem = toolBarAreaLayout.item(path.mid(1));
        Q_ASSERT(tbItem);
        return tbItem->widgetItem;
    }
#endif

#if QT_CONFIG(dockwidget)
    if (i == 1)
        return dockAreaLayout.item(path.mid(1)).widgetItem;
#endif // QT_CONFIG(dockwidget)

    return nullptr;
}